

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O2

void __thiscall Screen_Manager::Wait_For_Event(Screen_Manager *this,timeval *timeout)

{
  bool bVar1;
  
  while( true ) {
    bVar1 = Pending(this,(XEvent *)0x0);
    if (bVar1) break;
    Block(this,timeout);
  }
  return;
}

Assistant:

void
Screen_Manager::Wait_For_Event(timeval *timeout)
{
  while (!Pending())
    Block(timeout);
}